

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O1

void __thiscall
kratos::InterfaceRef::InterfaceRef
          (InterfaceRef *this,shared_ptr<kratos::IDefinition> *instance,Generator *gen,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->vars_)._M_h._M_buckets = &(this->vars_)._M_h._M_single_bucket;
  (this->vars_)._M_h._M_bucket_count = 1;
  (this->vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars_)._M_h._M_element_count = 0;
  (this->vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ports_)._M_h._M_buckets = &(this->ports_)._M_h._M_single_bucket;
  (this->ports_)._M_h._M_bucket_count = 1;
  (this->ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ports_)._M_h._M_element_count = 0;
  (this->ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_port_ = false;
  this->gen_ = gen;
  paVar2 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar2;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar5;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar4;
    (this->name_).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->has_instantiated_ = false;
  (this->mod_ports_)._M_h._M_buckets = &(this->mod_ports_)._M_h._M_single_bucket;
  (this->mod_ports_)._M_h._M_bucket_count = 1;
  (this->mod_ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mod_ports_)._M_h._M_element_count = 0;
  (this->mod_ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mod_ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mod_ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->modport_ports_)._M_h._M_buckets = &(this->modport_ports_)._M_h._M_single_bucket;
  (this->modport_ports_)._M_h._M_bucket_count = 1;
  (this->modport_ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modport_ports_)._M_h._M_element_count = 0;
  (this->modport_ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modport_ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modport_ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit InterfaceRef(std::shared_ptr<IDefinition> instance, Generator *gen, std::string name)
        : definition_(std::move(instance)), gen_(gen), name_(std::move(name)) {}